

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactTuple.h
# Opt level: O2

void __thiscall
chrono::ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>::
ChContactTuple(ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
               *this,ChContactContainer *mcontainer,ChContactable_3vars<6,_6,_6> *mobjA,
              ChContactable_1vars<3> *mobjB,ChCollisionInfo *cinfo)

{
  uint __line;
  char *__assertion;
  
  this->_vptr_ChContactTuple = (_func_int **)&PTR__ChContactTuple_0115ee88;
  (this->normal).m_data[2] = 0.0;
  (this->p1).m_data[0] = 0.0;
  (this->p1).m_data[1] = 0.0;
  (this->p1).m_data[2] = 0.0;
  (this->p2).m_data[0] = 0.0;
  (this->p2).m_data[1] = 0.0;
  (this->p2).m_data[2] = 0.0;
  (this->normal).m_data[0] = 0.0;
  (this->normal).m_data[1] = 0.0;
  if (mcontainer == (ChContactContainer *)0x0) {
    __assertion = "mcontainer";
    __line = 0x3e;
  }
  else if (mobjA == (ChContactable_3vars<6,_6,_6> *)0x0) {
    __assertion = "mobjA";
    __line = 0x3f;
  }
  else {
    if (mobjB != (ChContactable_1vars<3> *)0x0) {
      this->container = mcontainer;
      return;
    }
    __assertion = "mobjB";
    __line = 0x40;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactTuple.h"
                ,__line,
                "chrono::ChContactTuple<chrono::ChContactable_3vars<6, 6, 6>, chrono::ChContactable_1vars<3>>::ChContactTuple(ChContactContainer *, Ta *, Tb *, const collision::ChCollisionInfo &) [Ta = chrono::ChContactable_3vars<6, 6, 6>, Tb = chrono::ChContactable_1vars<3>]"
               );
}

Assistant:

ChContactTuple(ChContactContainer* mcontainer,          ///< contact container
                   Ta* mobjA,                               ///< ChContactable object A
                   Tb* mobjB,                               ///< ChContactable object B
                   const collision::ChCollisionInfo& cinfo  ///< data for the contact pair
    ) {
        assert(mcontainer);
        assert(mobjA);
        assert(mobjB);

        container = mcontainer;
    }